

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_for.cpp
# Opt level: O2

int main(void)

{
  short sVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  char *local_38;
  
  local_38 = "Adrian";
  pmVar3 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar3 = 0x3df;
  local_38 = "Kerrie";
  pmVar3 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar3 = 0x390;
  local_38 = "Nicholas";
  pmVar3 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar3 = 0x69;
  local_38 = "Elizabeth";
  pmVar3 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar3 = 0xe7;
  local_38 = "Wilson";
  pmVar3 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar3 = 0x36a;
  local_38 = "Joyce";
  pmVar3 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar3 = 0xe4;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (p_Var5 = person._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &person._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    pcVar2 = *(char **)(p_Var5 + 1);
    sVar1 = *(short *)&p_Var5[1]._M_parent;
    poVar4 = std::operator<<((ostream *)&std::cout,"[\"");
    poVar4 = std::operator<<(poVar4,pcVar2);
    poVar4 = std::operator<<(poVar4,"\"]");
    poVar4 = std::operator<<(poVar4,"=\t");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar1);
    std::operator<<(poVar4,'\n');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return 0;
}

Assistant:

int main () {
	//Let's give the map values;
	person["Adrian"] 	= 991;
	person["Kerrie"] 	= 912;
	person["Nicholas"] 	= 105;
	person["Elizabeth"] = 231;
	person["Wilson"] 	= 874;
	person["Joyce"] 	= 228;

	std::cout << std::endl;
	for (auto[x,y] : person) {
		std::cout << "[\"" << x << "\"]" << "=\t" << y << '\n';
	}
	std::cout << std::endl;
}